

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *p,Aig_Obj_t *pObj,int f,int *pVisited,int nVisCounter)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = pObj->Id * p->nFrames + f;
  if (pVisited[iVar2] != nVisCounter) {
    pVisited[iVar2] = nVisCounter;
    pAVar1 = p->pAig;
    uVar3 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar4 = uVar3 & 7;
    if ((uVar4 != 2) || (pAVar1->nTruePis <= (pObj->field_0).CioId)) {
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
      }
      if (uVar4 != 1) {
        if ((uVar4 != 2) || ((pObj->field_0).CioId < pAVar1->nTruePis)) {
          if ((uVar4 == 3) && (pAVar1->nTruePos <= (pObj->field_0).CioId)) {
            Ssw_SmlSimulateOneDyn_rec
                      (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,pVisited,
                       nVisCounter);
            Ssw_SmlNodeCopyFanin(p,pObj,f);
            return;
          }
          if ((uVar3 & 7) - 7 < 0xfffffffe) {
            __assert_fail("Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                          ,0x44c,
                          "void Ssw_SmlSimulateOneDyn_rec(Ssw_Sml_t *, Aig_Obj_t *, int, int *, int)"
                         );
          }
          Ssw_SmlSimulateOneDyn_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),f,pVisited,
                     nVisCounter);
          Ssw_SmlSimulateOneDyn_rec
                    (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),f,pVisited,
                     nVisCounter);
          Ssw_SmlNodeSimulate(p,pObj,f);
          return;
        }
        if (f != 0) {
          if (pAVar1->nTruePis <= (pObj->field_0).CioId) {
            uVar3 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
            if (((int)uVar3 < 0) || (pAVar1->vCos->nSize <= (int)uVar3)) {
LAB_0061ec97:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Ssw_SmlSimulateOneDyn_rec
                      (p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar3],f + -1,pVisited,nVisCounter);
            if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
              pAVar1 = p->pAig;
              if (pAVar1->nTruePis <= (pObj->field_0).CioId) {
                uVar3 = ((pObj->field_0).CioId - pAVar1->nTruePis) + pAVar1->nTruePos;
                if ((-1 < (int)uVar3) && ((int)uVar3 < pAVar1->vCos->nSize)) {
                  Ssw_SmlNodeTransferNext(p,(Aig_Obj_t *)pAVar1->vCos->pArray[uVar3],pObj,f + -1);
                  return;
                }
                goto LAB_0061ec97;
              }
            }
          }
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
      }
    }
  }
  return;
}

Assistant:

void Ssw_SmlSimulateOneDyn_rec( Ssw_Sml_t * p, Aig_Obj_t * pObj, int f, int * pVisited, int nVisCounter )
{
//    if ( Aig_ObjIsTravIdCurrent(p->pAig, pObj) )
//        return;
//    Aig_ObjSetTravIdCurrent(p->pAig, pObj);
    if ( pVisited[p->nFrames*pObj->Id+f] == nVisCounter )
        return;
    pVisited[p->nFrames*pObj->Id+f] = nVisCounter;
    if ( Saig_ObjIsPi( p->pAig, pObj ) || Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsLo( p->pAig, pObj ) )
    {
        if ( f == 0 )
            return;
        Ssw_SmlSimulateOneDyn_rec( p, Saig_ObjLoToLi(p->pAig, pObj), f-1, pVisited, nVisCounter );
        Ssw_SmlNodeTransferNext( p, Saig_ObjLoToLi(p->pAig, pObj), pObj, f-1 );
        return;
    }
    if ( Saig_ObjIsLi( p->pAig, pObj ) )
    {
        Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
        Ssw_SmlNodeCopyFanin( p, pObj, f );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin0(pObj), f, pVisited, nVisCounter );
    Ssw_SmlSimulateOneDyn_rec( p, Aig_ObjFanin1(pObj), f, pVisited, nVisCounter );
    Ssw_SmlNodeSimulate( p, pObj, f );
}